

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::verifyXFBData
          (FunctionalTest1_2 *this,void *xfb_data,_variable_type *variable_type)

{
  _variable_type _Var1;
  uint uVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  _variable_type *variable_type_03;
  float fVar5;
  double dVar6;
  string local_718;
  MessageBuilder local_6f8;
  string local_578;
  MessageBuilder local_558;
  string local_3d8;
  MessageBuilder local_3b8;
  uint local_238 [2];
  int *int_value_ptr;
  float *float_value_ptr;
  double *double_value_ptr;
  uint n_component_1;
  uint ref_value_1;
  uint n_ref_value_1;
  uint n_ref_values_1;
  uint ref_values_1 [2];
  MessageBuilder local_1d8;
  uint local_58 [2];
  int *result_value_ptr;
  uint n_component;
  uint ref_value;
  uint n_ref_value;
  uint n_ref_values;
  uint ref_values [2];
  uchar *traveller_ptr;
  bool result;
  uint n_variable_type_components;
  float epsilon;
  _variable_type base_variable_type;
  _variable_type *variable_type_local;
  void *xfb_data_local;
  FunctionalTest1_2 *this_local;
  
  _Var1 = Utils::getBaseVariableType(variable_type);
  uVar2 = Utils::getNumberOfComponentsForVariableType(variable_type);
  traveller_ptr._3_1_ = true;
  ref_values = (uint  [2])xfb_data;
  if (_Var1 == VARIABLE_TYPE_BOOL) {
    _n_ref_value = 0x100000000;
    ref_value = 2;
    for (n_component = 0; n_component < 2; n_component = n_component + 1) {
      result_value_ptr._4_4_ = (&n_ref_value)[n_component];
      for (result_value_ptr._0_4_ = 0; (uint)result_value_ptr < uVar2;
          result_value_ptr._0_4_ = (uint)result_value_ptr + 1) {
        local_58[0] = ref_values[0];
        local_58[1] = ref_values[1];
        if (*(uint *)ref_values != result_value_ptr._4_4_) {
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1d8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_1d8,
                              (char (*) [45])"Invalid value reported by subroutine using [");
          Utils::getVariableTypeGLSLString_abi_cxx11_
                    ((string *)ref_values_1,(Utils *)variable_type,variable_type_00);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)ref_values_1);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [35])" argument/return types (expected:[");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&result_value_ptr + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])"], found:[");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)local_58);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b785fd);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)ref_values_1);
          tcu::MessageBuilder::~MessageBuilder(&local_1d8);
          traveller_ptr._3_1_ = false;
          break;
        }
        ref_values = (uint  [2])((long)ref_values + 4);
      }
    }
  }
  else {
    _n_ref_value_1 = 0x500000004;
    ref_value_1 = 2;
    for (n_component_1 = 0; n_component_1 < 2; n_component_1 = n_component_1 + 1) {
      double_value_ptr._4_4_ = (&n_ref_value_1)[n_component_1];
      for (double_value_ptr._0_4_ = 0; (uint)double_value_ptr < uVar2;
          double_value_ptr._0_4_ = (uint)double_value_ptr + 1) {
        float_value_ptr = (float *)ref_values;
        int_value_ptr = (int *)ref_values;
        local_238[0] = ref_values[0];
        local_238[1] = ref_values[1];
        switch(_Var1) {
        case VARIABLE_TYPE_DOUBLE:
          dVar6 = de::abs<double>(*(double *)ref_values - (double)double_value_ptr._4_4_);
          if (9.999999747378752e-06 < dVar6) {
            pTVar3 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_3b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_3b8,
                                (char (*) [45])"Invalid value reported by subroutine using [");
            Utils::getVariableTypeGLSLString_abi_cxx11_
                      (&local_3d8,(Utils *)variable_type,variable_type_01);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3d8);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (pMVar4,(char (*) [35])" argument/return types (expected:[");
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&double_value_ptr + 4));
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])"], found:[");
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(double *)float_value_ptr);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b785fd);
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_3d8);
            tcu::MessageBuilder::~MessageBuilder(&local_3b8);
            traveller_ptr._3_1_ = false;
          }
          ref_values = (uint  [2])((long)ref_values + 8);
          break;
        default:
          break;
        case VARIABLE_TYPE_FLOAT:
          fVar5 = de::abs<float>(*(float *)ref_values - (float)double_value_ptr._4_4_);
          if (1e-05 < fVar5) {
            pTVar3 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_558,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_558,
                                (char (*) [45])"Invalid value reported by subroutine using [");
            Utils::getVariableTypeGLSLString_abi_cxx11_
                      (&local_578,(Utils *)variable_type,variable_type_02);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_578);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (pMVar4,(char (*) [35])" argument/return types (expected:[");
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&double_value_ptr + 4));
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])"], found:[");
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)int_value_ptr);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b785fd);
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_578);
            tcu::MessageBuilder::~MessageBuilder(&local_558);
            traveller_ptr._3_1_ = false;
          }
          ref_values = (uint  [2])((long)ref_values + 4);
          break;
        case VARIABLE_TYPE_INT:
        case VARIABLE_TYPE_UINT:
          if (*(uint *)ref_values != double_value_ptr._4_4_) {
            pTVar3 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_6f8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (&local_6f8,
                                (char (*) [45])"Invalid value reported by subroutine using [");
            Utils::getVariableTypeGLSLString_abi_cxx11_
                      (&local_718,(Utils *)variable_type,variable_type_03);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_718);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
            pMVar4 = tcu::MessageBuilder::operator<<
                               (pMVar4,(char (*) [35])" argument/return types (expected:[");
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&double_value_ptr + 4));
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])"], found:[");
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)local_238);
            pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2b785fd);
            tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_718);
            tcu::MessageBuilder::~MessageBuilder(&local_6f8);
            traveller_ptr._3_1_ = false;
          }
          ref_values = (uint  [2])((long)ref_values + 4);
        }
      }
    }
  }
  return traveller_ptr._3_1_;
}

Assistant:

bool FunctionalTest1_2::verifyXFBData(const void* xfb_data, const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type base_variable_type		   = Utils::getBaseVariableType(variable_type);
	const float					epsilon					   = 1e-5f;
	const unsigned int			n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	bool						result					   = true;
	const unsigned char*		traveller_ptr			   = (const unsigned char*)xfb_data;

	/* Boolean arguments/return types are tested with a slightly different shader so we
	 * need to test them in a separate code-path.
	 */
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* 0 should be returned when getter0 is used, 1 otherwise */
		const unsigned int ref_values[] = { 0, 1 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				int* result_value_ptr = (int*)(traveller_ptr);

				if (*result_value_ptr != (int)ref_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																   "["
									   << Utils::getVariableTypeGLSLString(variable_type) << "]"
									   << " argument/return types ("
										  "expected:["
									   << ref_value << "], found:[" << *result_value_ptr << "])"
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}

				traveller_ptr += sizeof(int);
			} /* for (all components) */
		}	 /* for (all reference values) */
	}		  /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
	else
	{
		/* 4 should be returned when getter0 is used, 5 otherwise */
		const unsigned int ref_values[] = { 4, 5 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			DE_ASSERT(
				base_variable_type == Utils::VARIABLE_TYPE_DOUBLE || base_variable_type == Utils::VARIABLE_TYPE_FLOAT ||
				base_variable_type == Utils::VARIABLE_TYPE_INT || base_variable_type == Utils::VARIABLE_TYPE_UINT);

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				const double* double_value_ptr = (double*)traveller_ptr;
				const float*  float_value_ptr  = (float*)traveller_ptr;
				const int*	int_value_ptr	= (int*)traveller_ptr;

				switch (base_variable_type)
				{
				case Utils::VARIABLE_TYPE_DOUBLE:
				{
					if (de::abs(*double_value_ptr - (double)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *double_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(double);
					break;
				}

				case Utils::VARIABLE_TYPE_FLOAT:
				{
					if (de::abs(*float_value_ptr - (float)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *float_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(float);
					break;
				}

				case Utils::VARIABLE_TYPE_INT:
				case Utils::VARIABLE_TYPE_UINT:
				{
					if (*int_value_ptr != (int)ref_value)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *int_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(int);
					break;
				}

				default:
					break;
				} /* switch (base_variable_type) */
			}	 /* for (all components) */
		}		  /* for (all reference values) */
	}

	return result;
}